

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O0

double __thiscall
duckdb::Interpolator<true>::Interpolate<unsigned_long,double,duckdb::QuantileIndirect<double>>
          (Interpolator<true> *this,unsigned_long lidx,unsigned_long hidx,Vector *result,
          QuantileIndirect<double> *accessor)

{
  double *src;
  double dVar1;
  Vector *in_stack_ffffffffffffffc8;
  QuantileIndirect<double> *in_stack_ffffffffffffffd0;
  
  src = (double *)
        QuantileIndirect<double>::operator()
                  (in_stack_ffffffffffffffd0,(INPUT_TYPE *)in_stack_ffffffffffffffc8);
  dVar1 = CastInterpolation::Cast<double,double>(src,in_stack_ffffffffffffffc8);
  return dVar1;
}

Assistant:

TARGET_TYPE Interpolate(INPUT_TYPE lidx, INPUT_TYPE hidx, Vector &result, const ACCESSOR &accessor) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
	}